

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

Matrix33<float> * __thiscall
Imath_2_5::Matrix33<float>::gjInverse
          (Matrix33<float> *__return_storage_ptr__,Matrix33<float> *this,bool singExc)

{
  ulong uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 *puVar4;
  SingMatrixExc *this_00;
  long lVar5;
  undefined8 *puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined4 *puVar13;
  long lVar14;
  undefined8 *puVar15;
  long lVar16;
  long lVar17;
  undefined4 *puVar18;
  long lVar19;
  bool bVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  Matrix33<float> t;
  Matrix33<float> s;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  float local_58;
  undefined4 local_54 [6];
  undefined8 uStack_3c;
  float local_34;
  
  puVar4 = local_54;
  local_54[5] = 0;
  uStack_3c = 0;
  local_54[1] = 0;
  local_54[2] = 0;
  local_54[3] = 0;
  local_54[0] = 0x3f800000;
  local_54[4] = 0x3f800000;
  local_34 = 1.0;
  lVar5 = (long)&uStack_70 + 4;
  local_58 = this->x[2][2];
  local_68 = *(undefined8 *)(this->x[1] + 1);
  uStack_60 = *(undefined8 *)this->x[2];
  local_78 = *(undefined8 *)this->x[0];
  uStack_70 = *(undefined8 *)(this->x[0] + 2);
  uVar10 = 1;
  lVar11 = 0x18;
  puVar12 = &local_78;
  puVar13 = local_54;
  uVar7 = 0;
  lVar14 = lVar5;
  do {
    puVar13 = puVar13 + 3;
    uVar1 = uVar7 + 1;
    fVar23 = *(float *)(&local_78 + uVar7 * 2);
    fVar21 = -fVar23;
    if (-fVar23 <= fVar23) {
      fVar21 = fVar23;
    }
    lVar16 = 0;
    uVar9 = uVar10 & 0xffffffff;
    uVar8 = uVar7 & 0xffffffff;
    do {
      fVar23 = *(float *)(lVar14 + lVar16);
      fVar22 = -fVar23;
      if (-fVar23 <= fVar23) {
        fVar22 = fVar23;
      }
      uVar3 = uVar9;
      if (fVar22 <= fVar21) {
        fVar22 = fVar21;
        uVar3 = uVar8;
      }
      uVar8 = uVar3;
      uVar9 = (ulong)((int)uVar9 + 1);
      lVar16 = lVar16 + 0xc;
      fVar21 = fVar22;
    } while (lVar11 != lVar16);
    if ((fVar22 == 0.0) && (!NAN(fVar22))) goto LAB_0012b83c;
    uVar9 = uVar10;
    lVar16 = lVar5;
    puVar18 = puVar13;
    if (uVar7 != uVar8) {
      lVar19 = (long)(int)uVar8;
      lVar17 = 0;
      do {
        uVar2 = *(undefined4 *)((long)puVar12 + lVar17 * 4);
        *(undefined4 *)((long)puVar12 + lVar17 * 4) =
             *(undefined4 *)((long)&local_78 + lVar17 * 4 + lVar19 * 0xc);
        *(undefined4 *)((long)&local_78 + lVar17 * 4 + lVar19 * 0xc) = uVar2;
        uVar2 = puVar4[lVar17];
        puVar4[lVar17] = local_54[lVar19 * 3 + lVar17];
        local_54[lVar19 * 3 + lVar17] = uVar2;
        lVar17 = lVar17 + 1;
      } while (lVar17 != 3);
    }
    do {
      fVar23 = -*(float *)((long)&local_78 + uVar7 * 4 + uVar9 * 0xc) /
               *(float *)(&local_78 + uVar7 * 2);
      lVar17 = 0;
      do {
        fVar21 = *(float *)((long)puVar4 + lVar17);
        fVar22 = *(float *)((long)puVar18 + lVar17);
        *(float *)(lVar16 + lVar17) =
             *(float *)((long)puVar12 + lVar17) * fVar23 + *(float *)(lVar16 + lVar17);
        *(float *)((long)puVar18 + lVar17) = fVar21 * fVar23 + fVar22;
        lVar17 = lVar17 + 4;
      } while (lVar17 != 0xc);
      bVar20 = uVar9 < 2;
      uVar9 = uVar9 + 1;
      lVar16 = lVar16 + 0xc;
      puVar18 = puVar18 + 3;
    } while (bVar20);
    uVar10 = uVar10 + 1;
    lVar14 = lVar14 + 0x10;
    lVar11 = lVar11 + -0xc;
    puVar4 = puVar4 + 3;
    puVar12 = (undefined8 *)((long)puVar12 + 0xc);
    lVar5 = lVar5 + 0xc;
    uVar7 = uVar1;
  } while (uVar1 != 2);
  if ((local_58 != 0.0) || (NAN(local_58))) {
    puVar12 = &uStack_60;
    puVar6 = &uStack_3c;
    lVar5 = 2;
    fVar23 = local_58;
    do {
      lVar14 = 0;
      do {
        *(float *)((long)puVar12 + lVar14 * 4) = *(float *)((long)puVar12 + lVar14 * 4) / fVar23;
        *(float *)((long)puVar6 + lVar14 * 4) = *(float *)((long)puVar6 + lVar14 * 4) / fVar23;
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      lVar14 = lVar5 + -1;
      if (lVar5 == 0) {
        __return_storage_ptr__->x[2][2] = local_34;
        *(ulong *)(__return_storage_ptr__->x[1] + 1) = CONCAT44(local_54[5],local_54[4]);
        *(undefined8 *)__return_storage_ptr__->x[2] = uStack_3c;
        *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(local_54[1],local_54[0]);
        *(ulong *)(__return_storage_ptr__->x[0] + 2) = CONCAT44(local_54[3],local_54[2]);
        return __return_storage_ptr__;
      }
      lVar11 = 0;
      puVar4 = local_54;
      puVar15 = &local_78;
      do {
        fVar23 = -*(float *)((long)&local_78 + lVar5 * 4 + lVar11 * 0xc);
        lVar16 = 0;
        do {
          fVar21 = *(float *)((long)puVar6 + lVar16);
          fVar22 = *(float *)((long)puVar4 + lVar16);
          *(float *)((long)puVar15 + lVar16) =
               *(float *)((long)puVar12 + lVar16) * fVar23 + *(float *)((long)puVar15 + lVar16);
          *(float *)((long)puVar4 + lVar16) = fVar21 * fVar23 + fVar22;
          lVar16 = lVar16 + 4;
        } while (lVar16 != 0xc);
        lVar11 = lVar11 + 1;
        puVar4 = puVar4 + 3;
        puVar15 = (undefined8 *)((long)puVar15 + 0xc);
      } while (lVar11 != lVar5);
      fVar23 = *(float *)(&local_78 + lVar14 * 2);
      puVar6 = (undefined8 *)((long)puVar6 + -0xc);
      puVar12 = (undefined8 *)((long)puVar12 + -0xc);
      lVar5 = lVar14;
    } while ((fVar23 != 0.0) || (NAN(fVar23)));
  }
LAB_0012b83c:
  if (!singExc) {
    *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 0) + 8) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 0) = 0.0;
    *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
    __return_storage_ptr__->x[0][0] = 1.0;
    __return_storage_ptr__->x[1][1] = 1.0;
    __return_storage_ptr__->x[2][2] = 1.0;
    return __return_storage_ptr__;
  }
  this_00 = (SingMatrixExc *)__cxa_allocate_exception(0x48);
  SingMatrixExc::SingMatrixExc(this_00,"Cannot invert singular matrix.");
  __cxa_throw(this_00,&SingMatrixExc::typeinfo,SingMatrixExc::~SingMatrixExc);
}

Assistant:

Matrix33<T>
Matrix33<T>::gjInverse (bool singExc) const
{
    int i, j, k;
    Matrix33 s;
    Matrix33 t (*this);

    // Forward elimination

    for (i = 0; i < 2 ; i++)
    {
        int pivot = i;

        T pivotsize = t[i][i];

        if (pivotsize < 0)
            pivotsize = -pivotsize;

        for (j = i + 1; j < 3; j++)
        {
            T tmp = t[j][i];

            if (tmp < 0)
                tmp = -tmp;

            if (tmp > pivotsize)
            {
                pivot = j;
                pivotsize = tmp;
            }
        }

        if (pivotsize == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix33();
        }

        if (pivot != i)
        {
            for (j = 0; j < 3; j++)
            {
                T tmp;

                tmp = t[i][j];
                t[i][j] = t[pivot][j];
                t[pivot][j] = tmp;

                tmp = s[i][j];
                s[i][j] = s[pivot][j];
                s[pivot][j] = tmp;
            }
        }

        for (j = i + 1; j < 3; j++)
        {
            T f = t[j][i] / t[i][i];

            for (k = 0; k < 3; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    // Backward substitution

    for (i = 2; i >= 0; --i)
    {
        T f;

        if ((f = t[i][i]) == 0)
        {
            if (singExc)
                throw ::IMATH_INTERNAL_NAMESPACE::SingMatrixExc ("Cannot invert singular matrix.");

            return Matrix33();
        }

        for (j = 0; j < 3; j++)
        {
            t[i][j] /= f;
            s[i][j] /= f;
        }

        for (j = 0; j < i; j++)
        {
            f = t[j][i];

            for (k = 0; k < 3; k++)
            {
                t[j][k] -= f * t[i][k];
                s[j][k] -= f * s[i][k];
            }
        }
    }

    return s;
}